

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

KeyInfo * sqlite3KeyInfoOfIndex(Parse *pParse,Index *pIdx)

{
  KeyInfo *p;
  CollSeq *pCVar1;
  int X;
  uint uVar2;
  uint N;
  ulong uVar3;
  
  if (pParse->nErr == 0) {
    uVar2 = (uint)pIdx->nColumn;
    if ((pIdx->field_0x63 & 8) == 0) {
      X = 0;
      N = uVar2;
    }
    else {
      N = (uint)pIdx->nKeyCol;
      X = uVar2 - N;
    }
    p = sqlite3KeyInfoAlloc(pParse->db,N,X);
    if (p != (KeyInfo *)0x0) {
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          if (pIdx->azColl[uVar3] == "BINARY") {
            pCVar1 = (CollSeq *)0x0;
          }
          else {
            pCVar1 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar3]);
          }
          p->aColl[uVar3] = pCVar1;
          p->aSortOrder[uVar3] = pIdx->aSortOrder[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if (pParse->nErr == 0) {
        return p;
      }
      p->nRef = p->nRef - 1;
      if (p->nRef == 0) {
        sqlite3DbFreeNN(p->db,p);
      }
    }
  }
  return (KeyInfo *)0x0;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoOfIndex(Parse *pParse, Index *pIdx){
  int i;
  int nCol = pIdx->nColumn;
  int nKey = pIdx->nKeyCol;
  KeyInfo *pKey;
  if( pParse->nErr ) return 0;
  if( pIdx->uniqNotNull ){
    pKey = sqlite3KeyInfoAlloc(pParse->db, nKey, nCol-nKey);
  }else{
    pKey = sqlite3KeyInfoAlloc(pParse->db, nCol, 0);
  }
  if( pKey ){
    assert( sqlite3KeyInfoIsWriteable(pKey) );
    for(i=0; i<nCol; i++){
      const char *zColl = pIdx->azColl[i];
      pKey->aColl[i] = zColl==sqlite3StrBINARY ? 0 :
                        sqlite3LocateCollSeq(pParse, zColl);
      pKey->aSortOrder[i] = pIdx->aSortOrder[i];
    }
    if( pParse->nErr ){
      sqlite3KeyInfoUnref(pKey);
      pKey = 0;
    }
  }
  return pKey;
}